

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O3

void __thiscall pbrt::Shape::readFrom(Shape *this,BinaryReader *binary)

{
  ulong uVar1;
  uchar uVar2;
  size_t sVar3;
  pointer puVar4;
  runtime_error *this_00;
  ulong uVar5;
  
  BinaryReader::read<pbrt::Material>(binary,&this->material);
  BinaryReader::read<std::__cxx11::string,std::shared_ptr<pbrt::Texture>>(binary,&this->textures);
  BinaryReader::read<pbrt::AreaLight>(binary,&this->areaLight);
  sVar3 = binary->currentEntityOffset;
  uVar1 = sVar3 + 1;
  puVar4 = (binary->currentEntityData).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = (long)(binary->currentEntityData).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar4;
  if (uVar5 < uVar1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"invalid read attempt by entity - not enough data in data block!");
  }
  else {
    uVar2 = puVar4[sVar3];
    binary->currentEntityOffset = uVar1;
    this->reverseOrientation = uVar2 != '\0';
    if (sVar3 + 5 <= uVar5) {
      this->alpha = *(float *)(puVar4 + uVar1);
      binary->currentEntityOffset = binary->currentEntityOffset + 4;
      return;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"invalid read attempt by entity - not enough data in data block!");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Shape::readFrom(BinaryReader &binary) 
  {
    binary.read(material);
    binary.read(textures);
    binary.read(areaLight);
    reverseOrientation = binary.read<int8_t>();
    binary.read(alpha);
  }